

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  string *__return_storage_ptr__;
  _Rb_tree_header *p_Var1;
  Finder *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Descriptor *type;
  Message *pMVar5;
  MessageLite *this_00;
  _Base_ptr p_Var6;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar7;
  LogMessage *pLVar8;
  Reflection *this_01;
  _Base_ptr p_Var9;
  LogMessage local_150;
  undefined1 local_118 [8];
  DynamicMessageFactory factory;
  string serialized_value;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  FieldDescriptor *local_90;
  FieldDescriptor *type_url_field;
  string url_prefix;
  string full_type_name;
  FieldDescriptor *value_field;
  LogFinisher local_31;
  undefined4 extraout_var_00;
  
  bVar3 = internal::GetAnyFieldDescriptors
                    (message,&local_90,(FieldDescriptor **)((long)&full_type_name.field_2 + 8));
  if (!bVar3) {
    return false;
  }
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  __return_storage_ptr__ = (string *)((long)&serialized_value.field_2 + 8);
  Reflection::GetString_abi_cxx11_(__return_storage_ptr__,this_01,message,local_90);
  type_url_field = (FieldDescriptor *)&url_prefix._M_string_length;
  url_prefix._M_dataplus._M_p = (pointer)0x0;
  url_prefix._M_string_length._0_1_ = 0;
  url_prefix.field_2._8_8_ = &full_type_name._M_string_length;
  full_type_name._M_dataplus._M_p = (pointer)0x0;
  full_type_name._M_string_length._0_1_ = 0;
  bVar3 = internal::ParseAnyTypeUrl
                    (__return_storage_ptr__,(string *)&type_url_field,
                     (string *)((long)&url_prefix.field_2 + 8));
  if (bVar3) {
    pFVar2 = this->finder_;
    if (pFVar2 == (Finder *)0x0) {
      type = anon_unknown_20::DefaultFinderFindAnyType
                       (message,(string *)&type_url_field,(string *)((long)&url_prefix.field_2 + 8))
      ;
    }
    else {
      iVar4 = (*pFVar2->_vptr_Finder[4])
                        (pFVar2,message,&type_url_field,
                         (undefined1 *)((long)&url_prefix.field_2 + 8));
      type = (Descriptor *)CONCAT44(extraout_var,iVar4);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_118);
      pMVar5 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_118,type);
      iVar4 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
      this_00 = (MessageLite *)CONCAT44(extraout_var_00,iVar4);
      Reflection::GetString_abi_cxx11_
                ((string *)
                 &factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next,
                 this_01,message,(FieldDescriptor *)full_type_name.field_2._8_8_);
      bVar3 = MessageLite::ParseFromString
                        (this_00,(string *)
                                 &factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.
                                  __list.__next);
      if (bVar3) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"[",1);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,serialized_value.field_2._8_8_,local_a8);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"]",1);
        p_Var9 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_002ee162:
          puVar7 = &this->default_field_value_printer_;
        }
        else {
          p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = &p_Var1->_M_header;
          do {
            if (*(ulong *)(p_Var9 + 1) >= (ulong)full_type_name.field_2._8_8_) {
              p_Var6 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)
                     [*(ulong *)(p_Var9 + 1) < (ulong)full_type_name.field_2._8_8_];
          } while (p_Var9 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
             ((ulong)full_type_name.field_2._8_8_ < *(ulong *)(p_Var6 + 1))) goto LAB_002ee162;
          puVar7 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                    *)&p_Var6[1]._M_parent;
        }
        p_Var9 = (_Base_ptr)
                 (puVar7->_M_t).
                 super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 .
                 super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                 ._M_head_impl;
        (**(code **)(*(long *)&p_Var9->_M_color + 0x70))
                  (p_Var9,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)this_00,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (**(code **)(*(long *)&p_Var9->_M_color + 0x80))
                  (p_Var9,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_150,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
                   ,0x7aa);
        pLVar8 = internal::LogMessage::operator<<
                           (&local_150,(string *)((long)&serialized_value.field_2 + 8));
        pLVar8 = internal::LogMessage::operator<<(pLVar8,": failed to parse contents");
        internal::LogFinisher::operator=(&local_31,pLVar8);
        internal::LogMessage::~LogMessage(&local_150);
      }
      if (factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next !=
          (__pthread_internal_list *)&serialized_value._M_string_length) {
        operator_delete(factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.
                        __next);
      }
      (*this_00->_vptr_MessageLite[1])();
      DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_118);
      goto LAB_002ee2be;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_118,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
               ,0x7a1);
    pLVar8 = internal::LogMessage::operator<<
                       ((LogMessage *)local_118,"Can\'t print proto content: proto type ");
    pLVar8 = internal::LogMessage::operator<<
                       (pLVar8,(string *)((long)&serialized_value.field_2 + 8));
    pLVar8 = internal::LogMessage::operator<<(pLVar8," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar8);
    internal::LogMessage::~LogMessage((LogMessage *)local_118);
  }
  bVar3 = false;
LAB_002ee2be:
  if ((size_type *)url_prefix.field_2._8_8_ != &full_type_name._M_string_length) {
    operator_delete((void *)url_prefix.field_2._8_8_);
  }
  if (type_url_field != (FieldDescriptor *)&url_prefix._M_string_length) {
    operator_delete(type_url_field);
  }
  if ((undefined1 *)serialized_value.field_2._8_8_ != local_a0) {
    operator_delete((void *)serialized_value.field_2._8_8_);
  }
  return bVar3;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    GOOGLE_LOG(WARNING) << "Can't print proto content: proto type " << type_url
                 << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}